

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O3

Formattable * __thiscall icu_63::Formattable::operator=(Formattable *this,Formattable *source)

{
  Type TVar1;
  uint count;
  int iVar2;
  Formattable *pFVar3;
  undefined4 extraout_var;
  DecimalQuantity *this_00;
  CharString *this_01;
  UnicodeString *this_02;
  Formattable *other;
  CharString *s;
  UErrorCode status;
  UErrorCode local_1c;
  
  if (this == source) {
    return this;
  }
  other = source;
  dispose(this);
  TVar1 = source->fType;
  this->fType = TVar1;
  switch(TVar1) {
  case kDate:
  case kDouble:
    (this->fValue).fObject = (source->fValue).fObject;
    goto switchD_0021e529_default;
  case kLong:
  case kInt64:
    pFVar3 = (Formattable *)(source->fValue).fObject;
    break;
  case kString:
    this_02 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)other);
    if (this_02 != (UnicodeString *)0x0) {
      other = (Formattable *)(source->fValue).fString;
      UnicodeString::UnicodeString(this_02,(UnicodeString *)other);
    }
    (this->fValue).fString = this_02;
    goto switchD_0021e529_default;
  case kArray:
    count = (source->fValue).fArrayAndCount.fCount;
    other = (Formattable *)(ulong)count;
    (this->fValue).fArrayAndCount.fCount = count;
    pFVar3 = createArrayCopy((source->fValue).fArrayAndCount.fArray,count);
    break;
  case kObject:
    iVar2 = (*((source->fValue).fObject)->_vptr_UObject[3])();
    pFVar3 = (Formattable *)CONCAT44(extraout_var,iVar2);
    break;
  default:
    goto switchD_0021e529_default;
  }
  (this->fValue).fInt64 = (int64_t)pFVar3;
switchD_0021e529_default:
  local_1c = U_ZERO_ERROR;
  if (source->fDecimalQuantity != (DecimalQuantity *)0x0) {
    this_00 = (DecimalQuantity *)UMemory::operator_new((UMemory *)0x50,(size_t)other);
    if (this_00 != (DecimalQuantity *)0x0) {
      other = (Formattable *)source->fDecimalQuantity;
      icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_00,(DecimalQuantity *)other);
    }
    this->fDecimalQuantity = this_00;
  }
  if (source->fDecimalStr != (CharString *)0x0) {
    this_01 = (CharString *)UMemory::operator_new((UMemory *)0x40,(size_t)other);
    if (this_01 != (CharString *)0x0) {
      s = source->fDecimalStr;
      CharString::CharString(this_01,s,&local_1c);
      this->fDecimalStr = this_01;
      if (local_1c < U_ILLEGAL_ARGUMENT_ERROR) {
        return this;
      }
      MaybeStackArray<char,_40>::~MaybeStackArray((MaybeStackArray<char,_40> *)this_01);
      UMemory::operator_delete((UMemory *)this_01,s);
    }
    this->fDecimalStr = (CharString *)0x0;
  }
  return this;
}

Assistant:

Formattable&
Formattable::operator=(const Formattable& source)
{
    if (this != &source)
    {
        // Disposes the current formattable value/setting.
        dispose();

        // Sets the correct data type for this value.
        fType = source.fType;
        switch (fType)
        {
        case kArray:
            // Sets each element in the array one by one and records the array count.
            fValue.fArrayAndCount.fCount = source.fValue.fArrayAndCount.fCount;
            fValue.fArrayAndCount.fArray = createArrayCopy(source.fValue.fArrayAndCount.fArray,
                                                           source.fValue.fArrayAndCount.fCount);
            break;
        case kString:
            // Sets the string value.
            fValue.fString = new UnicodeString(*source.fValue.fString);
            break;
        case kDouble:
            // Sets the double value.
            fValue.fDouble = source.fValue.fDouble;
            break;
        case kLong:
        case kInt64:
            // Sets the long value.
            fValue.fInt64 = source.fValue.fInt64;
            break;
        case kDate:
            // Sets the Date value.
            fValue.fDate = source.fValue.fDate;
            break;
        case kObject:
            fValue.fObject = objectClone(source.fValue.fObject);
            break;
        }

        UErrorCode status = U_ZERO_ERROR;
        if (source.fDecimalQuantity != NULL) {
          fDecimalQuantity = new DecimalQuantity(*source.fDecimalQuantity);
        }
        if (source.fDecimalStr != NULL) {
            fDecimalStr = new CharString(*source.fDecimalStr, status);
            if (U_FAILURE(status)) {
                delete fDecimalStr;
                fDecimalStr = NULL;
            }
        }
    }
    return *this;
}